

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coop.c
# Opt level: O1

void thread1(void)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  char str [64];
  char **local_80;
  char *local_78 [9];
  
  local_78[0] = "[Thread 1] started";
  fiber_exec_on(&the_thread->fiber,&(the_thread->sched->main_thread).fiber,run_put_str,local_78);
  if (the_thread->sched->shutdown_signal == false) {
    iVar2 = -1;
    uVar3 = 1;
    uVar1 = 0;
    do {
      snprintf((char *)local_78,0x40,"[Thread 1] running: %d",uVar1);
      local_80 = local_78;
      fiber_exec_on(&the_thread->fiber,&(the_thread->sched->main_thread).fiber,run_put_str,&local_80
                   );
      if ((int)(uVar3 / 0x1e) * 0x20 + (int)(uVar3 / 0x1e) * -2 + iVar2 == 0) {
        message = MsgFork;
      }
      else if (iVar2 + (int)(uVar3 / 6) * 6 == 0) {
        message = MsgPing;
      }
      thread_switch(the_thread,the_thread->next);
      iVar2 = iVar2 + -1;
      uVar3 = (ulong)((int)uVar3 + 1);
      uVar1 = (ulong)((int)uVar1 + 1);
    } while (the_thread->sched->shutdown_signal != true);
  }
  local_78[0] = "[Thread 1] exiting";
  fiber_exec_on(&the_thread->fiber,&(the_thread->sched->main_thread).fiber,run_put_str,local_78);
  return;
}

Assistant:

static void
thread1(void)
{
    put_str("[Thread 1] started");
    int tok = 0;
    while (!shutting_down()) {
        char str[64];
        snprintf(str, sizeof str, "[Thread 1] running: %d", tok++);
        put_str(str);
        if (tok % 30 == 0)
            message = MsgFork;
        else if (tok % 6 == 0)
            message = MsgPing;
        yield();
    }
    put_str("[Thread 1] exiting");
}